

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

void env_free(Environment *env)

{
  ObjectType OVar1;
  Record *pRVar2;
  Record *__ptr;
  Record *rec;
  Object *__ptr_00;
  
  __ptr = env->front;
  do {
    if (__ptr == (Record *)0x0) {
      free(env);
      return;
    }
    pRVar2 = __ptr->next;
    OVar1 = (__ptr->object).type;
    if (OVar1 == OBJECT_INSTANCE) {
      __ptr_00 = (Object *)(__ptr->object).field_1.instance;
      OVar1 = __ptr_00->type;
      __ptr_00->type = OVar1 - OBJECT_LITERAL;
      if (((int)OVar1 < 2) && (*(int *)((long)&__ptr_00->field_1 + 8) == 0)) {
        env_free(*(Environment **)((long)&__ptr_00->field_1 + 0x10));
        goto LAB_00106668;
      }
    }
    else if (OVar1 == OBJECT_ARRAY) {
      __ptr_00 = (__ptr->object).field_1.arr.values;
LAB_00106668:
      free(__ptr_00);
    }
    free(__ptr);
    env->front = pRVar2;
    __ptr = pRVar2;
  } while( true );
}

Assistant:

void env_free(Environment *env){
    while(env->front != NULL){
        Record *rec = env->front;
        Record *bak = rec->next;
        if(rec->object.type == OBJECT_ARRAY)
            memfree(rec->object.arr.values);
        else if(rec->object.type == OBJECT_INSTANCE){
            gc_rec(rec);
        }
        //        memfree(rec->name);
        memfree(rec);
        env->front = bak;
    }
    memfree(env);
}